

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3BestIndexMethod(sqlite3_vtab *pVTab,sqlite3_index_info *pInfo)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  sqlite3_index_constraint_usage *psVar4;
  bool bVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  uchar *puVar14;
  ulong uVar15;
  bool bVar16;
  
  pInfo->idxNum = 0;
  pInfo->estimatedCost = 5000000.0;
  if ((long)pInfo->nConstraint < 1) {
    uVar10 = 0xffffffff;
    uVar7 = 0xffffffff;
    uVar6 = 0xffffffff;
    uVar12 = 0xffffffff;
  }
  else {
    puVar14 = &pInfo->aConstraint->usable;
    uVar12 = 0xffffffff;
    uVar15 = 0;
    uVar6 = 0xffffffff;
    uVar8 = 0xffffffff;
    uVar11 = 0xffffffff;
    do {
      if (*puVar14 == '\0') {
        bVar5 = false;
        if (puVar14[-1] == '@') {
          pInfo->idxNum = 0;
          pInfo->estimatedCost = 1e+50;
          pInfo->estimatedRows = 0x4000000000000;
          bVar5 = true;
        }
      }
      else {
        iVar13 = ((sqlite3_index_constraint *)(puVar14 + -5))->iColumn;
        if (iVar13 < 0) {
          bVar16 = true;
        }
        else {
          bVar16 = iVar13 == *(int *)&pVTab[2].pModule + 1;
        }
        if (((int)uVar12 < 0) && ((bool)(puVar14[-1] == '\x02' & bVar16))) {
          pInfo->idxNum = 1;
          pInfo->estimatedCost = 1.0;
          uVar12 = (uint)uVar15;
        }
        bVar2 = puVar14[-1];
        if ((-1 < iVar13 && bVar2 == 0x40) && (iVar13 <= *(int *)&pVTab[2].pModule)) {
          pInfo->idxNum = iVar13 + 2;
          pInfo->estimatedCost = 2.0;
          uVar12 = (uint)uVar15;
        }
        if ((bVar2 == 2) && (iVar13 == *(int *)&pVTab[2].pModule + 2)) {
          uVar11 = uVar15 & 0xffffffff;
        }
        bVar5 = false;
        if (bVar16) {
          switch((uint)bVar2 << 0x1e | bVar2 - 4 >> 2) {
          case 0:
          case 7:
            uVar8 = uVar15 & 0xffffffff;
            bVar5 = false;
            break;
          case 1:
          case 3:
            uVar6 = uVar15 & 0xffffffff;
            bVar5 = false;
          }
        }
      }
      uVar7 = (uint)uVar8;
      uVar10 = (uint)uVar11;
      if (bVar5) {
        return 0;
      }
      uVar15 = uVar15 + 1;
      puVar14 = puVar14 + 0xc;
    } while ((long)pInfo->nConstraint != uVar15);
  }
  uVar3 = pInfo->idxNum;
  if (uVar3 == 1) {
    *(byte *)&pInfo->idxFlags = (byte)pInfo->idxFlags | 1;
  }
  if ((int)uVar12 < 0) {
    iVar13 = 1;
  }
  else {
    psVar4 = pInfo->aConstraintUsage;
    psVar4[uVar12].argvIndex = 1;
    psVar4[uVar12].omit = '\x01';
    iVar13 = 2;
  }
  if (-1 < (int)uVar10) {
    pInfo->idxNum = uVar3 | 0x10000;
    pInfo->aConstraintUsage[uVar10].argvIndex = iVar13;
    iVar13 = iVar13 + 1;
  }
  if (-1 < (int)uVar7) {
    pbVar1 = (byte *)((long)&pInfo->idxNum + 2);
    *pbVar1 = *pbVar1 | 2;
    pInfo->aConstraintUsage[uVar7].argvIndex = iVar13;
    iVar13 = iVar13 + 1;
  }
  if (-1 < (int)uVar6) {
    pbVar1 = (byte *)((long)&pInfo->idxNum + 2);
    *pbVar1 = *pbVar1 | 4;
    pInfo->aConstraintUsage[uVar6].argvIndex = iVar13;
  }
  if (pInfo->nOrderBy == 1) {
    iVar13 = pInfo->aOrderBy->iColumn;
    if ((iVar13 < 0) || (iVar13 == *(int *)&pVTab[2].pModule + 1)) {
      pcVar9 = "DESC";
      if (pInfo->aOrderBy->desc == '\0') {
        pcVar9 = "ASC";
      }
      pInfo->idxStr = pcVar9;
      pInfo->orderByConsumed = 1;
    }
  }
  return 0;
}

Assistant:

static int fts3BestIndexMethod(sqlite3_vtab *pVTab, sqlite3_index_info *pInfo){
  Fts3Table *p = (Fts3Table *)pVTab;
  int i;                          /* Iterator variable */
  int iCons = -1;                 /* Index of constraint to use */

  int iLangidCons = -1;           /* Index of langid=x constraint, if present */
  int iDocidGe = -1;              /* Index of docid>=x constraint, if present */
  int iDocidLe = -1;              /* Index of docid<=x constraint, if present */
  int iIdx;

  /* By default use a full table scan. This is an expensive option,
  ** so search through the constraints to see if a more efficient 
  ** strategy is possible.
  */
  pInfo->idxNum = FTS3_FULLSCAN_SEARCH;
  pInfo->estimatedCost = 5000000;
  for(i=0; i<pInfo->nConstraint; i++){
    int bDocid;                 /* True if this constraint is on docid */
    struct sqlite3_index_constraint *pCons = &pInfo->aConstraint[i];
    if( pCons->usable==0 ){
      if( pCons->op==SQLITE_INDEX_CONSTRAINT_MATCH ){
        /* There exists an unusable MATCH constraint. This means that if
        ** the planner does elect to use the results of this call as part
        ** of the overall query plan the user will see an "unable to use
        ** function MATCH in the requested context" error. To discourage
        ** this, return a very high cost here.  */
        pInfo->idxNum = FTS3_FULLSCAN_SEARCH;
        pInfo->estimatedCost = 1e50;
        fts3SetEstimatedRows(pInfo, ((sqlite3_int64)1) << 50);
        return SQLITE_OK;
      }
      continue;
    }

    bDocid = (pCons->iColumn<0 || pCons->iColumn==p->nColumn+1);

    /* A direct lookup on the rowid or docid column. Assign a cost of 1.0. */
    if( iCons<0 && pCons->op==SQLITE_INDEX_CONSTRAINT_EQ && bDocid ){
      pInfo->idxNum = FTS3_DOCID_SEARCH;
      pInfo->estimatedCost = 1.0;
      iCons = i;
    }

    /* A MATCH constraint. Use a full-text search.
    **
    ** If there is more than one MATCH constraint available, use the first
    ** one encountered. If there is both a MATCH constraint and a direct
    ** rowid/docid lookup, prefer the MATCH strategy. This is done even 
    ** though the rowid/docid lookup is faster than a MATCH query, selecting
    ** it would lead to an "unable to use function MATCH in the requested 
    ** context" error.
    */
    if( pCons->op==SQLITE_INDEX_CONSTRAINT_MATCH 
     && pCons->iColumn>=0 && pCons->iColumn<=p->nColumn
    ){
      pInfo->idxNum = FTS3_FULLTEXT_SEARCH + pCons->iColumn;
      pInfo->estimatedCost = 2.0;
      iCons = i;
    }

    /* Equality constraint on the langid column */
    if( pCons->op==SQLITE_INDEX_CONSTRAINT_EQ 
     && pCons->iColumn==p->nColumn + 2
    ){
      iLangidCons = i;
    }

    if( bDocid ){
      switch( pCons->op ){
        case SQLITE_INDEX_CONSTRAINT_GE:
        case SQLITE_INDEX_CONSTRAINT_GT:
          iDocidGe = i;
          break;

        case SQLITE_INDEX_CONSTRAINT_LE:
        case SQLITE_INDEX_CONSTRAINT_LT:
          iDocidLe = i;
          break;
      }
    }
  }

  /* If using a docid=? or rowid=? strategy, set the UNIQUE flag. */
  if( pInfo->idxNum==FTS3_DOCID_SEARCH ) fts3SetUniqueFlag(pInfo);

  iIdx = 1;
  if( iCons>=0 ){
    pInfo->aConstraintUsage[iCons].argvIndex = iIdx++;
    pInfo->aConstraintUsage[iCons].omit = 1;
  } 
  if( iLangidCons>=0 ){
    pInfo->idxNum |= FTS3_HAVE_LANGID;
    pInfo->aConstraintUsage[iLangidCons].argvIndex = iIdx++;
  } 
  if( iDocidGe>=0 ){
    pInfo->idxNum |= FTS3_HAVE_DOCID_GE;
    pInfo->aConstraintUsage[iDocidGe].argvIndex = iIdx++;
  } 
  if( iDocidLe>=0 ){
    pInfo->idxNum |= FTS3_HAVE_DOCID_LE;
    pInfo->aConstraintUsage[iDocidLe].argvIndex = iIdx++;
  } 

  /* Regardless of the strategy selected, FTS can deliver rows in rowid (or
  ** docid) order. Both ascending and descending are possible. 
  */
  if( pInfo->nOrderBy==1 ){
    struct sqlite3_index_orderby *pOrder = &pInfo->aOrderBy[0];
    if( pOrder->iColumn<0 || pOrder->iColumn==p->nColumn+1 ){
      if( pOrder->desc ){
        pInfo->idxStr = "DESC";
      }else{
        pInfo->idxStr = "ASC";
      }
      pInfo->orderByConsumed = 1;
    }
  }

  assert( p->pSegments==0 );
  return SQLITE_OK;
}